

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detach_info.cpp
# Opt level: O0

unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true> __thiscall
duckdb::DetachInfo::Copy(DetachInfo *this)

{
  pointer pDVar1;
  long in_RSI;
  unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_> in_RDI;
  templated_unique_single_t *result;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  OnEntryNotFound OVar2;
  
  make_uniq<duckdb::DetachInfo>();
  pDVar1 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  ::std::__cxx11::string::operator=((string *)&pDVar1->name,(string *)(in_RSI + 0x10));
  OVar2 = *(OnEntryNotFound *)(in_RSI + 0x30);
  pDVar1 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)CONCAT17(OVar2,in_stack_ffffffffffffffa0));
  pDVar1->if_not_found = OVar2;
  return (unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>)
         (__uniq_ptr_impl<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::DetachInfo_*,_std::default_delete<duckdb::DetachInfo>_>.
         super__Head_base<0UL,_duckdb::DetachInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<DetachInfo> DetachInfo::Copy() const {
	auto result = make_uniq<DetachInfo>();
	result->name = name;
	result->if_not_found = if_not_found;
	return result;
}